

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O3

void __thiscall
Test<const_Imf_3_4::Header>::testIterators(Test<const_Imf_3_4::Header> *this,string *name)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  Header header;
  undefined8 local_60;
  Header local_58 [56];
  
  local_60 = 0;
  Imf_3_4::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  lVar1 = Imf_3_4::Header::find((char *)local_58);
  lVar1 = *(long *)(lVar1 + 0x120);
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::Header::begin();
  while( true ) {
    p_Var2 = (_Rb_tree_node_base *)Imf_3_4::Header::end();
    if (p_Var4 == p_Var2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                    ,0x39,
                    "void Test<const Imf_3_4::Header>::testIterators(const string &) [Header = const Imf_3_4::Header]"
                   );
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  if (*(long *)(p_Var4 + 9) == lVar1) {
    Imf_3_4::Header::~Header(local_58);
    return;
  }
  __assert_fail("&iterator.attribute () == &comparand",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x34,
                "void Test<const Imf_3_4::Header>::testIterators(const string &) [Header = const Imf_3_4::Header]"
               );
}

Assistant:

void testIterators (const string& name)
    {
        Header header;

        auto& comparand = header.find ("displayWindow").attribute ();

        for (auto iterator = header.begin (); iterator != header.end ();
             ++iterator)
        {
            if (iterator.name () == name)
            {
                assert (&iterator.attribute () == &comparand);
                return;
            }
        }

        assert (false);
    }